

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpeg.c
# Opt level: O0

size_t sei_render_size(sei_t *sei)

{
  sei_t *in_RDI;
  sei_message_t *msg;
  size_t size;
  sei_message_t *local_20;
  size_t local_18;
  size_t local_8;
  
  if ((in_RDI == (sei_t *)0x0) || (in_RDI->head == (sei_message_t *)0x0)) {
    local_8 = 0;
  }
  else {
    local_18 = 2;
    for (local_20 = sei_message_head(in_RDI); local_20 != (sei_message_t *)0x0;
        local_20 = sei_message_next(local_20)) {
      local_18 = (local_20->size << 2) / 3 +
                 local_20->size / 0xff + 2 + (local_20->type / 0xff + 1) + local_18;
    }
    local_8 = local_18;
  }
  return local_8;
}

Assistant:

size_t sei_render_size(sei_t* sei)
{
    if (!sei || !sei->head) {
        return 0;
    }

    size_t size = 2; // nalu_type + stop bit
    sei_message_t* msg;
    for (msg = sei_message_head(sei); msg; msg = sei_message_next(msg)) {
        size += 1 + (msg->type / 255);
        size += 1 + (msg->size / 255);
        size += 1 + (msg->size * 4 / 3);
    }

    return size;
}